

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

char * __thiscall cmTarget::GetProperty(cmTarget *this,string *prop)

{
  bool bVar1;
  __type _Var2;
  int iVar3;
  TargetType targetType;
  size_type sVar4;
  cmTargetInternals *pcVar5;
  cmMakefile *pcVar6;
  cmState *this_00;
  char *pcVar7;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar8;
  cmStateSnapshot local_290;
  cmStateDirectory local_278;
  byte local_249;
  char *pcStack_248;
  bool chain;
  char *retVal;
  cmStateDirectory local_228;
  cmStateSnapshot local_200;
  cmStateDirectory local_1e8;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_100;
  undefined1 local_f8;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_f0;
  undefined1 local_e8;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_e0;
  undefined1 local_d8;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_d0;
  undefined1 local_c8;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_c0;
  undefined1 local_b8;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_b0;
  undefined1 local_a8;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_a0;
  undefined1 local_98;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_90;
  undefined1 local_88;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_80;
  undefined1 local_78;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_70;
  undefined1 local_68;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_60;
  undefined1 local_58;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_50;
  undefined1 local_48;
  allocator local_3f;
  allocator local_3e;
  allocator local_3d;
  allocator local_3c;
  allocator local_3b;
  allocator local_3a;
  allocator local_39;
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35 [20];
  allocator local_21;
  string *local_20;
  string *prop_local;
  cmTarget *this_local;
  
  local_20 = prop;
  prop_local = (string *)this;
  if ((GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_
                                 ), iVar3 != 0)) {
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::unordered_set(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_);
    __cxa_atexit(std::
                 unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~unordered_set,&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_
                 ,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propLINK_LIBRARIES_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propLINK_LIBRARIES_abi_cxx11_), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&GetProperty(std::__cxx11::string_const&)::propLINK_LIBRARIES_abi_cxx11_,
               "LINK_LIBRARIES",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propLINK_LIBRARIES_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propLINK_LIBRARIES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_),
     iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_,"TYPE",
               local_35);
    std::allocator<char>::~allocator((allocator<char> *)local_35);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propINCLUDE_DIRECTORIES_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propINCLUDE_DIRECTORIES_abi_cxx11_), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               &GetProperty(std::__cxx11::string_const&)::propINCLUDE_DIRECTORIES_abi_cxx11_,
               "INCLUDE_DIRECTORIES",&local_36);
    std::allocator<char>::~allocator((allocator<char> *)&local_36);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propINCLUDE_DIRECTORIES_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::
                         propINCLUDE_DIRECTORIES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propCOMPILE_FEATURES_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propCOMPILE_FEATURES_abi_cxx11_), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&GetProperty(std::__cxx11::string_const&)::propCOMPILE_FEATURES_abi_cxx11_,
               "COMPILE_FEATURES",&local_37);
    std::allocator<char>::~allocator((allocator<char> *)&local_37);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propCOMPILE_FEATURES_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propCOMPILE_FEATURES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propCOMPILE_OPTIONS_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propCOMPILE_OPTIONS_abi_cxx11_), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&GetProperty(std::__cxx11::string_const&)::propCOMPILE_OPTIONS_abi_cxx11_,
               "COMPILE_OPTIONS",&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_38);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propCOMPILE_OPTIONS_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propCOMPILE_OPTIONS_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propCOMPILE_DEFINITIONS_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propCOMPILE_DEFINITIONS_abi_cxx11_), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               &GetProperty(std::__cxx11::string_const&)::propCOMPILE_DEFINITIONS_abi_cxx11_,
               "COMPILE_DEFINITIONS",&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propCOMPILE_DEFINITIONS_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::
                         propCOMPILE_DEFINITIONS_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propIMPORTED_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::propIMPORTED_abi_cxx11_
                                 ), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&GetProperty(std::__cxx11::string_const&)::propIMPORTED_abi_cxx11_,
               "IMPORTED",&local_3a);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propIMPORTED_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propIMPORTED_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_ == '\0')
     && (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                      propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               &GetProperty(std::__cxx11::string_const&)::propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_
               ,"MANUALLY_ADDED_DEPENDENCIES",&local_3b);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::
                  propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::
                         propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propNAME_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::propNAME_abi_cxx11_),
     iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&GetProperty(std::__cxx11::string_const&)::propNAME_abi_cxx11_,"NAME",
               &local_3c);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propNAME_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propNAME_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propBINARY_DIR_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propBINARY_DIR_abi_cxx11_), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&GetProperty(std::__cxx11::string_const&)::propBINARY_DIR_abi_cxx11_,
               "BINARY_DIR",&local_3d);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propBINARY_DIR_abi_cxx11_,&__dso_handle)
    ;
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propBINARY_DIR_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propSOURCE_DIR_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propSOURCE_DIR_abi_cxx11_), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&GetProperty(std::__cxx11::string_const&)::propSOURCE_DIR_abi_cxx11_,
               "SOURCE_DIR",&local_3e);
    std::allocator<char>::~allocator((allocator<char> *)&local_3e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propSOURCE_DIR_abi_cxx11_,&__dso_handle)
    ;
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propSOURCE_DIR_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propSOURCES_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::propSOURCES_abi_cxx11_)
     , iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&GetProperty(std::__cxx11::string_const&)::propSOURCES_abi_cxx11_,"SOURCES"
               ,&local_3f);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propSOURCES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propSOURCES_abi_cxx11_);
  }
  bVar1 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_);
  if (bVar1) {
    pVar8 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,
                     &GetProperty(std::__cxx11::string_const&)::propLINK_LIBRARIES_abi_cxx11_);
    local_50._M_cur =
         (__node_type *)
         pVar8.first.
         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ._M_cur;
    local_48 = pVar8.second;
    pVar8 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,
                     &GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_);
    local_60._M_cur =
         (__node_type *)
         pVar8.first.
         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ._M_cur;
    local_58 = pVar8.second;
    pVar8 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,
                     &GetProperty(std::__cxx11::string_const&)::propINCLUDE_DIRECTORIES_abi_cxx11_);
    local_70._M_cur =
         (__node_type *)
         pVar8.first.
         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ._M_cur;
    local_68 = pVar8.second;
    pVar8 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,
                     &GetProperty(std::__cxx11::string_const&)::propCOMPILE_FEATURES_abi_cxx11_);
    local_80._M_cur =
         (__node_type *)
         pVar8.first.
         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ._M_cur;
    local_78 = pVar8.second;
    pVar8 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,
                     &GetProperty(std::__cxx11::string_const&)::propCOMPILE_OPTIONS_abi_cxx11_);
    local_90._M_cur =
         (__node_type *)
         pVar8.first.
         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ._M_cur;
    local_88 = pVar8.second;
    pVar8 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,
                     &GetProperty(std::__cxx11::string_const&)::propCOMPILE_DEFINITIONS_abi_cxx11_);
    local_a0._M_cur =
         (__node_type *)
         pVar8.first.
         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ._M_cur;
    local_98 = pVar8.second;
    pVar8 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,
                     &GetProperty(std::__cxx11::string_const&)::propIMPORTED_abi_cxx11_);
    local_b0._M_cur =
         (__node_type *)
         pVar8.first.
         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ._M_cur;
    local_a8 = pVar8.second;
    pVar8 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,
                     &GetProperty(std::__cxx11::string_const&)::
                      propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_);
    local_c0._M_cur =
         (__node_type *)
         pVar8.first.
         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ._M_cur;
    local_b8 = pVar8.second;
    pVar8 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,
                     &GetProperty(std::__cxx11::string_const&)::propNAME_abi_cxx11_);
    local_d0._M_cur =
         (__node_type *)
         pVar8.first.
         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ._M_cur;
    local_c8 = pVar8.second;
    pVar8 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,
                     &GetProperty(std::__cxx11::string_const&)::propBINARY_DIR_abi_cxx11_);
    local_e0._M_cur =
         (__node_type *)
         pVar8.first.
         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ._M_cur;
    local_d8 = pVar8.second;
    pVar8 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,
                     &GetProperty(std::__cxx11::string_const&)::propSOURCE_DIR_abi_cxx11_);
    local_f0._M_cur =
         (__node_type *)
         pVar8.first.
         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ._M_cur;
    local_e8 = pVar8.second;
    pVar8 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,
                     &GetProperty(std::__cxx11::string_const&)::propSOURCES_abi_cxx11_);
    local_100._M_cur =
         (__node_type *)
         pVar8.first.
         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ._M_cur;
    local_f8 = pVar8.second;
  }
  sVar4 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,local_20);
  if (sVar4 != 0) {
    _Var2 = std::operator==(local_20,&GetProperty(std::__cxx11::string_const&)::
                                      propLINK_LIBRARIES_abi_cxx11_);
    if (_Var2) {
      pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&pcVar5->LinkImplementationPropertyEntries);
      if (!bVar1) {
        if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
           (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_
                                       ), iVar3 != 0)) {
          std::__cxx11::string::string
                    ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        }
        pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_120,&pcVar5->LinkImplementationPropertyEntries,";");
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                   (string *)&local_120);
        std::__cxx11::string::~string((string *)&local_120);
        pcVar7 = (char *)std::__cxx11::string::c_str();
        return pcVar7;
      }
      return (char *)0x0;
    }
    _Var2 = std::operator==(local_20,&GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_)
    ;
    if (_Var2) {
      targetType = GetType(this);
      pcVar7 = cmState::GetTargetTypeName(targetType);
      return pcVar7;
    }
    _Var2 = std::operator==(local_20,&GetProperty(std::__cxx11::string_const&)::
                                      propINCLUDE_DIRECTORIES_abi_cxx11_);
    if (_Var2) {
      pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&pcVar5->IncludeDirectoriesEntries);
      if (!bVar1) {
        if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
           (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_
                                       ), iVar3 != 0)) {
          std::__cxx11::string::string
                    ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        }
        pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_140,&pcVar5->IncludeDirectoriesEntries,";");
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                   (string *)&local_140);
        std::__cxx11::string::~string((string *)&local_140);
        pcVar7 = (char *)std::__cxx11::string::c_str();
        return pcVar7;
      }
      return (char *)0x0;
    }
    _Var2 = std::operator==(local_20,&GetProperty(std::__cxx11::string_const&)::
                                      propCOMPILE_FEATURES_abi_cxx11_);
    if (_Var2) {
      pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&pcVar5->CompileFeaturesEntries);
      if (!bVar1) {
        if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
           (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_
                                       ), iVar3 != 0)) {
          std::__cxx11::string::string
                    ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        }
        pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_160,&pcVar5->CompileFeaturesEntries,";");
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                   (string *)&local_160);
        std::__cxx11::string::~string((string *)&local_160);
        pcVar7 = (char *)std::__cxx11::string::c_str();
        return pcVar7;
      }
      return (char *)0x0;
    }
    _Var2 = std::operator==(local_20,&GetProperty(std::__cxx11::string_const&)::
                                      propCOMPILE_OPTIONS_abi_cxx11_);
    if (_Var2) {
      pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&pcVar5->CompileOptionsEntries);
      if (!bVar1) {
        if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
           (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_
                                       ), iVar3 != 0)) {
          std::__cxx11::string::string
                    ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        }
        pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_180,&pcVar5->CompileOptionsEntries,";");
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                   (string *)&local_180);
        std::__cxx11::string::~string((string *)&local_180);
        pcVar7 = (char *)std::__cxx11::string::c_str();
        return pcVar7;
      }
      return (char *)0x0;
    }
    _Var2 = std::operator==(local_20,&GetProperty(std::__cxx11::string_const&)::
                                      propCOMPILE_DEFINITIONS_abi_cxx11_);
    if (_Var2) {
      pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&pcVar5->CompileDefinitionsEntries);
      if (!bVar1) {
        if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
           (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_
                                       ), iVar3 != 0)) {
          std::__cxx11::string::string
                    ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        }
        pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_1a0,&pcVar5->CompileDefinitionsEntries,";");
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                   (string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_1a0);
        pcVar7 = (char *)std::__cxx11::string::c_str();
        return pcVar7;
      }
      return (char *)0x0;
    }
    _Var2 = std::operator==(local_20,&GetProperty(std::__cxx11::string_const&)::
                                      propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_);
    if (_Var2) {
      bVar1 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this->Utilities);
      if (!bVar1) {
        if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
           (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_
                                       ), iVar3 != 0)) {
          std::__cxx11::string::string
                    ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        }
        cmJoin<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                  (&local_1c0,&this->Utilities,";");
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                   (string *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_1c0);
        pcVar7 = (char *)std::__cxx11::string::c_str();
        return pcVar7;
      }
      return (char *)0x0;
    }
    _Var2 = std::operator==(local_20,&GetProperty(std::__cxx11::string_const&)::
                                      propIMPORTED_abi_cxx11_);
    if (_Var2) {
      bVar1 = IsImported(this);
      if (!bVar1) {
        return "FALSE";
      }
      return "TRUE";
    }
    _Var2 = std::operator==(local_20,&GetProperty(std::__cxx11::string_const&)::propNAME_abi_cxx11_)
    ;
    if (_Var2) {
      GetName_abi_cxx11_(this);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      return pcVar7;
    }
    _Var2 = std::operator==(local_20,&GetProperty(std::__cxx11::string_const&)::
                                      propBINARY_DIR_abi_cxx11_);
    if (_Var2) {
      pcVar6 = GetMakefile(this);
      cmMakefile::GetStateSnapshot(&local_200,pcVar6);
      cmStateSnapshot::GetDirectory(&local_1e8,&local_200);
      pcVar7 = cmStateDirectory::GetCurrentBinary(&local_1e8);
      return pcVar7;
    }
    _Var2 = std::operator==(local_20,&GetProperty(std::__cxx11::string_const&)::
                                      propSOURCE_DIR_abi_cxx11_);
    if (_Var2) {
      pcVar6 = GetMakefile(this);
      cmMakefile::GetStateSnapshot((cmStateSnapshot *)&retVal,pcVar6);
      cmStateSnapshot::GetDirectory(&local_228,(cmStateSnapshot *)&retVal);
      pcVar7 = cmStateDirectory::GetCurrentSource(&local_228);
      return pcVar7;
    }
  }
  pcStack_248 = cmPropertyMap::GetPropertyValue(&this->Properties,local_20);
  if (pcStack_248 == (char *)0x0) {
    pcVar6 = GetMakefile(this);
    this_00 = cmMakefile::GetState(pcVar6);
    local_249 = cmState::IsPropertyChained(this_00,local_20,TARGET);
    if ((bool)local_249) {
      cmMakefile::GetStateSnapshot(&local_290,this->Makefile);
      cmStateSnapshot::GetDirectory(&local_278,&local_290);
      pcVar7 = cmStateDirectory::GetProperty(&local_278,local_20,(bool)(local_249 & 1));
      return pcVar7;
    }
  }
  return pcStack_248;
}

Assistant:

const char* cmTarget::GetProperty(const std::string& prop) const
{
  static CM_UNORDERED_SET<std::string> specialProps;
#define MAKE_STATIC_PROP(PROP) static const std::string prop##PROP = #PROP
  MAKE_STATIC_PROP(LINK_LIBRARIES);
  MAKE_STATIC_PROP(TYPE);
  MAKE_STATIC_PROP(INCLUDE_DIRECTORIES);
  MAKE_STATIC_PROP(COMPILE_FEATURES);
  MAKE_STATIC_PROP(COMPILE_OPTIONS);
  MAKE_STATIC_PROP(COMPILE_DEFINITIONS);
  MAKE_STATIC_PROP(IMPORTED);
  MAKE_STATIC_PROP(MANUALLY_ADDED_DEPENDENCIES);
  MAKE_STATIC_PROP(NAME);
  MAKE_STATIC_PROP(BINARY_DIR);
  MAKE_STATIC_PROP(SOURCE_DIR);
  MAKE_STATIC_PROP(SOURCES);
#undef MAKE_STATIC_PROP
  if (specialProps.empty()) {
    specialProps.insert(propLINK_LIBRARIES);
    specialProps.insert(propTYPE);
    specialProps.insert(propINCLUDE_DIRECTORIES);
    specialProps.insert(propCOMPILE_FEATURES);
    specialProps.insert(propCOMPILE_OPTIONS);
    specialProps.insert(propCOMPILE_DEFINITIONS);
    specialProps.insert(propIMPORTED);
    specialProps.insert(propMANUALLY_ADDED_DEPENDENCIES);
    specialProps.insert(propNAME);
    specialProps.insert(propBINARY_DIR);
    specialProps.insert(propSOURCE_DIR);
    specialProps.insert(propSOURCES);
  }
  if (specialProps.count(prop)) {
    if (prop == propLINK_LIBRARIES) {
      if (this->Internal->LinkImplementationPropertyEntries.empty()) {
        return CM_NULLPTR;
      }

      static std::string output;
      output = cmJoin(this->Internal->LinkImplementationPropertyEntries, ";");
      return output.c_str();
    }
    // the type property returns what type the target is
    if (prop == propTYPE) {
      return cmState::GetTargetTypeName(this->GetType());
    }
    if (prop == propINCLUDE_DIRECTORIES) {
      if (this->Internal->IncludeDirectoriesEntries.empty()) {
        return CM_NULLPTR;
      }

      static std::string output;
      output = cmJoin(this->Internal->IncludeDirectoriesEntries, ";");
      return output.c_str();
    }
    if (prop == propCOMPILE_FEATURES) {
      if (this->Internal->CompileFeaturesEntries.empty()) {
        return CM_NULLPTR;
      }

      static std::string output;
      output = cmJoin(this->Internal->CompileFeaturesEntries, ";");
      return output.c_str();
    }
    if (prop == propCOMPILE_OPTIONS) {
      if (this->Internal->CompileOptionsEntries.empty()) {
        return CM_NULLPTR;
      }

      static std::string output;
      output = cmJoin(this->Internal->CompileOptionsEntries, ";");
      return output.c_str();
    }
    if (prop == propCOMPILE_DEFINITIONS) {
      if (this->Internal->CompileDefinitionsEntries.empty()) {
        return CM_NULLPTR;
      }

      static std::string output;
      output = cmJoin(this->Internal->CompileDefinitionsEntries, ";");
      return output.c_str();
    }
    if (prop == propMANUALLY_ADDED_DEPENDENCIES) {
      if (this->Utilities.empty()) {
        return CM_NULLPTR;
      }

      static std::string output;
      output = cmJoin(this->Utilities, ";");
      return output.c_str();
    }
    if (prop == propIMPORTED) {
      return this->IsImported() ? "TRUE" : "FALSE";
    }
    if (prop == propNAME) {
      return this->GetName().c_str();
    }
    if (prop == propBINARY_DIR) {
      return this->GetMakefile()
        ->GetStateSnapshot()
        .GetDirectory()
        .GetCurrentBinary();
    }
    if (prop == propSOURCE_DIR) {
      return this->GetMakefile()
        ->GetStateSnapshot()
        .GetDirectory()
        .GetCurrentSource();
    }
  }

  const char* retVal = this->Properties.GetPropertyValue(prop);
  if (!retVal) {
    const bool chain = this->GetMakefile()->GetState()->IsPropertyChained(
      prop, cmProperty::TARGET);
    if (chain) {
      return this->Makefile->GetStateSnapshot().GetDirectory().GetProperty(
        prop, chain);
    }
  }
  return retVal;
}